

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int Dau_Dsd6DecomposeSingleVarOne(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars,int v)

{
  int iVar1;
  ulong uVar2;
  char cVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  word wVar8;
  
  uVar7 = *pTruth;
  uVar2 = s_Truths6Neg[v];
  bVar4 = (byte)v;
  if ((uVar7 & 1) == 0) {
    if ((uVar2 & uVar7) == 0) {
      iVar1 = p->nPos;
      p->nPos = iVar1 + 1;
      p->pOutput[iVar1] = '(';
      if (5 < (uint)v) {
LAB_005106c3:
        __assert_fail("iVar >= 0 && iVar < 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x33c,"word Abc_Tt6Cofactor1(word, int)");
      }
      wVar8 = (s_Truths6[(uint)v] & *pTruth) >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) |
              s_Truths6[(uint)v] & *pTruth;
LAB_00510561:
      *pTruth = wVar8;
      goto LAB_0051068d;
    }
  }
  else if ((uVar2 & uVar7) == uVar2) {
    cVar3 = '!';
    lVar6 = 0;
    do {
      iVar1 = p->nPos;
      p->nPos = iVar1 + 1;
      p->pOutput[iVar1] = cVar3;
      cVar3 = "!("[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
    if (5 < (uint)v) goto LAB_005106c3;
    wVar8 = ~((s_Truths6[(uint)v] & *pTruth) >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) |
             s_Truths6[(uint)v] & *pTruth);
    goto LAB_00510561;
  }
  uVar5 = s_Truths6[v] & uVar7;
  if ((long)uVar7 < 0) {
    if (uVar5 == s_Truths6[v]) {
      cVar3 = '!';
      lVar6 = 1;
      do {
        iVar1 = p->nPos;
        p->nPos = iVar1 + 1;
        p->pOutput[iVar1] = cVar3;
        cVar3 = "!(!"[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      if (5 < (uint)v) goto LAB_005106e2;
      uVar7 = ~((uVar2 & *pTruth) << ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) | uVar2 & *pTruth);
      goto LAB_00510632;
    }
  }
  else if (uVar5 == 0) {
    cVar3 = '(';
    lVar6 = 0;
    do {
      iVar1 = p->nPos;
      p->nPos = iVar1 + 1;
      p->pOutput[iVar1] = cVar3;
      cVar3 = "!(!"[lVar6 + 2];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
    if (5 < (uint)v) goto LAB_005106e2;
    uVar7 = (uVar2 & *pTruth) << ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) | uVar2 & *pTruth;
LAB_00510632:
    *pTruth = uVar7;
    goto LAB_0051068d;
  }
  bVar4 = (byte)(1 << (bVar4 & 0x1f));
  if ((uVar2 & ~(uVar7 >> (bVar4 & 0x3f) ^ uVar7)) != 0) {
    return 0;
  }
  iVar1 = p->nPos;
  p->nPos = iVar1 + 1;
  p->pOutput[iVar1] = '[';
  if (5 < (uint)v) {
LAB_005106e2:
    __assert_fail("iVar >= 0 && iVar < 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x337,"word Abc_Tt6Cofactor0(word, int)");
  }
  *pTruth = (uVar2 & *pTruth) << (bVar4 & 0x3f) | uVar2 & *pTruth;
  p->uConstMask = p->uConstMask | 1 << ((byte)p->nConsts & 0x1f);
LAB_0051068d:
  p->nConsts = p->nConsts + 1;
  Dau_DsdWriteVar(p,pVars[(uint)v],0);
  pVars[(uint)v] = pVars[(long)nVars + -1];
  Abc_TtSwapVars(pTruth,nVars,v,nVars + -1);
  return 1;
}

Assistant:

static inline int Dau_Dsd6DecomposeSingleVarOne( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars, int v )
{
    // consider negative cofactors
    if ( pTruth[0] & 1 )
    {        
        if ( Abc_Tt6Cof0IsConst1( pTruth[0], v ) ) // !(ax)
        {
            Dau_DsdWriteString( p, "!(" );
            pTruth[0] = ~Abc_Tt6Cofactor1( pTruth[0], v );
            goto finish;            
        }
    }
    else
    {
        if ( Abc_Tt6Cof0IsConst0( pTruth[0], v ) ) // ax
        {
            Dau_DsdWriteString( p, "(" );
            pTruth[0] = Abc_Tt6Cofactor1( pTruth[0], v );
            goto finish;            
        }
    }
    // consider positive cofactors
    if ( pTruth[0] >> 63 )
    {        
        if ( Abc_Tt6Cof1IsConst1( pTruth[0], v ) ) // !(!ax)
        {
            Dau_DsdWriteString( p, "!(!" );
            pTruth[0] = ~Abc_Tt6Cofactor0( pTruth[0], v );
            goto finish;            
        }
    }
    else
    {
        if ( Abc_Tt6Cof1IsConst0( pTruth[0], v ) ) // !ax
        {
            Dau_DsdWriteString( p, "(!" );
            pTruth[0] = Abc_Tt6Cofactor0( pTruth[0], v );
            goto finish;            
        }
    }
    // consider equal cofactors
    if ( Abc_Tt6CofsOpposite( pTruth[0], v ) ) // [ax]
    {
        Dau_DsdWriteString( p, "[" );
        pTruth[0] = Abc_Tt6Cofactor0( pTruth[0], v );
        p->uConstMask |= (1 << p->nConsts);
        goto finish;            
    }
    return 0;

finish:
    p->nConsts++;
    Dau_DsdWriteVar( p, pVars[v], 0 );
    pVars[v] = pVars[nVars-1];
    Abc_TtSwapVars( pTruth, nVars, v, nVars-1 );
    return 1;
}